

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

zkbpp_lowmc_verify_implementation_f get_zkbpp_lowmc_verify_implementation(lowmc_parameters_t *lowmc)

{
  uint32_t uVar1;
  lowmc_parameters_t *in_RDI;
  uint32_t lowmc_id;
  zkbpp_lowmc_verify_implementation_f local_8;
  
  uVar1 = lowmc_get_id(in_RDI);
  if (((DAT_0022510c & 0x400) == 0x400) && ((DAT_0022510c & 0x20000) == 0x20000)) {
    if (uVar1 == 0x80000a) {
      local_8 = mpc_lowmc_verify_s256_lowmc_128_128_20;
      return local_8;
    }
    if (uVar1 == 0x81002b) {
      local_8 = mpc_lowmc_verify_s256_lowmc_129_129_4;
      return local_8;
    }
    if (uVar1 == 0xc0000a) {
      local_8 = mpc_lowmc_verify_s256_lowmc_192_192_30;
      return local_8;
    }
    if (uVar1 == 0xc00040) {
      local_8 = mpc_lowmc_verify_s256_lowmc_192_192_4;
      return local_8;
    }
    if (uVar1 == 0xff0055) {
      local_8 = mpc_lowmc_verify_s256_lowmc_255_255_4;
      return local_8;
    }
    if (uVar1 == 0x100000a) {
      local_8 = mpc_lowmc_verify_s256_lowmc_256_256_38;
      return local_8;
    }
  }
  if (uVar1 == 0x80000a) {
    local_8 = mpc_lowmc_verify_s128_lowmc_128_128_20;
  }
  else if (uVar1 == 0x81002b) {
    local_8 = mpc_lowmc_verify_s128_lowmc_129_129_4;
  }
  else if (uVar1 == 0xc0000a) {
    local_8 = mpc_lowmc_verify_s128_lowmc_192_192_30;
  }
  else if (uVar1 == 0xc00040) {
    local_8 = mpc_lowmc_verify_s128_lowmc_192_192_4;
  }
  else if (uVar1 == 0xff0055) {
    local_8 = mpc_lowmc_verify_s128_lowmc_255_255_4;
  }
  else {
    local_8 = mpc_lowmc_verify_s128_lowmc_256_256_38;
  }
  return local_8;
}

Assistant:

zkbpp_lowmc_verify_implementation_f
get_zkbpp_lowmc_verify_implementation(const lowmc_parameters_t* lowmc) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
#if defined(WITH_ZKBPP)
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      return mpc_lowmc_verify_s256_lowmc_128_128_20;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      return mpc_lowmc_verify_s256_lowmc_192_192_30;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      return mpc_lowmc_verify_s256_lowmc_256_256_38;
#endif
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      return mpc_lowmc_verify_s256_lowmc_129_129_4;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      return mpc_lowmc_verify_s256_lowmc_192_192_4;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      return mpc_lowmc_verify_s256_lowmc_255_255_4;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
#if defined(WITH_ZKBPP)
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      return mpc_lowmc_verify_s128_lowmc_128_128_20;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      return mpc_lowmc_verify_s128_lowmc_192_192_30;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      return mpc_lowmc_verify_s128_lowmc_256_256_38;
#endif
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      return mpc_lowmc_verify_s128_lowmc_129_129_4;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      return mpc_lowmc_verify_s128_lowmc_192_192_4;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      return mpc_lowmc_verify_s128_lowmc_255_255_4;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
#if defined(WITH_ZKBPP)
    /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
  case LOWMC_ID(128, 10):
    return mpc_lowmc_verify_uint64_lowmc_128_128_20;
#endif
#if defined(WITH_LOWMC_192_192_30)
  case LOWMC_ID(192, 10):
    return mpc_lowmc_verify_uint64_lowmc_192_192_30;
#endif
#if defined(WITH_LOWMC_256_256_38)
  case LOWMC_ID(256, 10):
    return mpc_lowmc_verify_uint64_lowmc_256_256_38;
#endif
#endif
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    return mpc_lowmc_verify_uint64_lowmc_129_129_4;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    return mpc_lowmc_verify_uint64_lowmc_192_192_4;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    return mpc_lowmc_verify_uint64_lowmc_255_255_4;
#endif
  }
#endif

  UNREACHABLE;
  return NULL;
}